

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::Int32ParseTester::Clear(Int32ParseTester *this)

{
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_int32_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_int32_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_hifield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_int32_hifield_);
  if ((*(byte *)((long)&this->field_0 + 0x18) & 0xf) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0xac) = 0;
    *(undefined8 *)((long)&this->field_0 + 0xb4) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Int32ParseTester::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.Int32ParseTester)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_int32_lowfield_.Clear();
  _impl_.packed_int32_lowfield_.Clear();
  _impl_.repeated_int32_midfield_.Clear();
  _impl_.packed_int32_midfield_.Clear();
  _impl_.repeated_int32_hifield_.Clear();
  _impl_.packed_int32_hifield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    ::memset(&_impl_.optional_int32_lowfield_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_int32_hifield_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_lowfield_)) + sizeof(_impl_.optional_int32_hifield_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}